

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O0

int __thiscall CVmObjBigNum::equals(CVmObjBigNum *this,vm_obj_id_t self,vm_val_t *val,int param_4)

{
  int iVar1;
  vm_val_t *this_00;
  int *in_RDX;
  vm_obj_id_t in_ESI;
  CVmObjBigNum *in_RDI;
  int ret;
  vm_val_t val2;
  vm_val_t *in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  vm_val_t local_38;
  undefined4 in_stack_ffffffffffffffe8;
  int local_4;
  
  if ((*in_RDX == 5) && (in_RDX[2] == in_ESI)) {
    local_4 = 1;
  }
  else {
    local_38.typ = in_RDX[0];
    local_38._4_4_ = in_RDX[1];
    local_38.val = *(anon_union_8_8_cb74652f_for_val *)(in_RDX + 2);
    iVar1 = cvt_to_bignum(in_RDI,(vm_obj_id_t)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                          in_stack_ffffffffffffffa8);
    if (iVar1 == 0) {
      local_4 = 0;
    }
    else {
      this_00 = CVmStack::push();
      vm_val_t::set_obj(this_00,in_ESI);
      CVmStack::push(&local_38);
      get_objid_ext(0);
      local_4 = compute_eq_exact((char *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),(char *)in_RDX);
      CVmStack::discard(2);
    }
  }
  return local_4;
}

Assistant:

int CVmObjBigNum::equals(VMG_ vm_obj_id_t self, const vm_val_t *val,
                         int /*depth*/) const
{
    vm_val_t val2;
    int ret;

    /* if the other value is a reference to self, we certainly match */
    if (val->typ == VM_OBJ && val->val.obj == self)
        return TRUE;

    /* convert it */
    val2 = *val;
    if (!cvt_to_bignum(vmg_ self, &val2))
    {
        /* this type is not convertible to BigNumber - it's not equal */
        return FALSE;
    }

    /* push our values for safekeeping from the garbage collector */
    G_stk->push()->set_obj(self);
    G_stk->push(&val2);

    /* check for equality and return the result */
    ret = compute_eq_exact(ext_,  get_objid_ext(vmg_ val2.val.obj));

    /* discard the stacked values */
    G_stk->discard(2);

    /* return the result */
    return ret;
}